

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall Pathie::Path::find(Path *this,_func_bool_Path_ptr *cb)

{
  Path *pPVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Path *pPVar5;
  Path path;
  entry_iterator iter;
  undefined1 local_a8 [32];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  Path local_68;
  entry_iterator local_48;
  
  entry_iterator::entry_iterator(&local_48,this);
  pPVar1 = (Path *)(local_a8 + 0x10);
  while( true ) {
    entry_iterator::entry_iterator((entry_iterator *)local_a8);
    bVar3 = entry_iterator::operator!=(&local_48,(entry_iterator *)local_a8);
    entry_iterator::~entry_iterator((entry_iterator *)local_a8);
    if (!bVar3) break;
    pPVar5 = entry_iterator::operator->(&local_48);
    pcVar2 = (pPVar5->m_path)._M_dataplus._M_p;
    local_a8._0_8_ = pPVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar2,pcVar2 + (pPVar5->m_path)._M_string_length);
    iVar4 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar4 == 0) {
      bVar3 = false;
    }
    else {
      pPVar5 = entry_iterator::operator->(&local_48);
      local_88[0] = local_78;
      pcVar2 = (pPVar5->m_path)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar2,pcVar2 + (pPVar5->m_path)._M_string_length);
      iVar4 = std::__cxx11::string::compare((char *)local_88);
      bVar3 = iVar4 != 0;
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
    }
    if ((Path *)local_a8._0_8_ != pPVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
    if (bVar3) {
      pPVar5 = entry_iterator::operator*(&local_48);
      Path(&local_68,pPVar5);
      join((Path *)local_a8,this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.m_path._M_dataplus._M_p != &local_68.m_path.field_2) {
        operator_delete(local_68.m_path._M_dataplus._M_p);
      }
      bVar3 = (*cb)((Path *)local_a8);
      if ((bVar3) && (bVar3 = is_directory((Path *)local_a8), bVar3)) {
        find((Path *)local_a8,cb);
      }
      if ((Path *)local_a8._0_8_ != pPVar1) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    entry_iterator::operator++(&local_48,0);
  }
  entry_iterator::~entry_iterator(&local_48);
  return;
}

Assistant:

void Path::find(bool (*cb)(const Path& entry)) const
{
  for(entry_iterator iter=begin_entries(); iter != end_entries(); iter++) {
    // Skip . and ..
    if (iter->str() != "." && iter->str() != "..") {
      Path path = join(*iter);
      if (cb(path) && path.is_directory()) {
        path.find(cb);
      }
    }
  }
}